

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward_int8_x86
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  int *piVar6;
  void *pvVar7;
  void *pvVar8;
  Layer *pLVar9;
  float fVar10;
  undefined1 uVar11;
  undefined3 uVar12;
  undefined4 uVar13;
  Mat *pMVar14;
  undefined8 uVar15;
  undefined1 auVar16 [32];
  undefined8 uVar17;
  int iVar18;
  _func_int **pp_Var19;
  undefined1 uVar20;
  uint uVar21;
  _func_int **pp_Var22;
  _func_int *p_Var23;
  undefined4 *puVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  uint _elempack;
  uint uVar28;
  int iVar29;
  float fVar30;
  iterator iVar31;
  pointer pfVar32;
  int iVar33;
  Option *_elemsize;
  undefined1 (*pauVar34) [16];
  Option *opt_00;
  int iVar35;
  long lVar36;
  undefined1 (*pauVar37) [16];
  long lVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  bool bVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  float fVar79;
  float fVar94;
  float fVar95;
  __m128 min;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar97;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar96;
  float fVar98;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  __m128 max;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar127;
  float fVar129;
  float fVar130;
  v4sf one;
  float fVar131;
  undefined1 auVar128 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  float *local_310;
  long local_2f8;
  float *local_2f0;
  undefined1 local_2e8 [40];
  undefined8 uStack_2c0;
  undefined8 uStack_2b8;
  int iStack_2b0;
  undefined4 uStack_2ac;
  size_t local_2a8;
  ulong local_298;
  _func_int **local_290;
  Mat *local_288;
  long local_280;
  Mat local_278;
  ulong local_230;
  Mat local_228;
  ulong local_1d8;
  float local_1cc;
  pointer local_1c8;
  int *local_1c0;
  Allocator *local_1b8;
  int local_1b0;
  Allocator *local_1a8;
  int local_1a0;
  int iStack_19c;
  int iStack_198;
  int iStack_194;
  undefined4 local_190;
  ulong local_188;
  _func_int **local_180;
  size_type local_178;
  long local_170;
  Mat local_168;
  void *local_120;
  int *local_118;
  ulong local_110;
  int local_108;
  Allocator *local_100;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  ulong local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  local_168.c = bottom_blob->c;
  local_168.elempack = bottom_blob->elempack;
  local_168.elemsize = bottom_blob->elemsize;
  pp_Var22 = this->_vptr_ConvolutionDepthWise_x86_avx;
  p_Var23 = pp_Var22[-3];
  iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var23);
  iVar35 = *(int *)(&this->field_0xd8 + (long)p_Var23);
  iVar29 = *(int *)(&this->field_0xdc + (long)p_Var23);
  iVar3 = *(int *)(&this->field_0xe0 + (long)p_Var23);
  piVar6 = bottom_blob->refcount;
  local_168.data = bottom_blob->data;
  local_168.refcount = bottom_blob->refcount;
  local_168.allocator = bottom_blob->allocator;
  local_168.dims = bottom_blob->dims;
  local_168.w = bottom_blob->w;
  local_168.h = bottom_blob->h;
  local_168.d = bottom_blob->d;
  local_168.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
    pp_Var22 = this->_vptr_ConvolutionDepthWise_x86_avx;
  }
  if (local_168.elempack == 0 || ((int)local_168.elemsize * 8) / local_168.elempack != 8) {
    uVar41 = (long)(local_168.elempack * local_168.c) /
             (long)*(int *)(&this->field_0x108 + (long)pp_Var22[-3]);
    local_228.cstep = 0;
    local_228.data = (undefined4 *)0x0;
    local_228.refcount._0_4_ = 0;
    local_228.refcount._4_4_ = 0;
    local_228.elemsize = 0;
    local_228.elempack = 0;
    local_228.allocator = (Allocator *)0x0;
    local_228.dims = 0;
    local_228.w = 0;
    local_228.h = 0;
    local_228.d = 0;
    local_228.c = 0;
    Mat::create(&local_228,local_168.elempack * local_168.c,4,(Allocator *)0x0);
    pp_Var22 = this->_vptr_ConvolutionDepthWise_x86_avx;
    p_Var23 = pp_Var22[-3];
    if (0 < *(int *)(&this->field_0x108 + (long)p_Var23)) {
      lVar26 = 0;
      puVar24 = (undefined4 *)local_228.data;
      do {
        if (0 < (int)uVar41) {
          uVar4 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var23) + lVar26 * 4);
          uVar40 = uVar41 & 0xffffffff;
          do {
            *puVar24 = uVar4;
            puVar24 = puVar24 + 1;
            uVar28 = (int)uVar40 - 1;
            uVar40 = (ulong)uVar28;
          } while (uVar28 != 0);
          p_Var23 = pp_Var22[-3];
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 < *(int *)(&this->field_0x108 + (long)p_Var23));
    }
    uVar11 = opt->lightmode;
    uVar12 = *(undefined3 *)&opt->field_0x1;
    uVar13 = opt->num_threads;
    local_2e8._4_4_ = uVar13;
    local_2e8._1_3_ = uVar12;
    local_2e8[0] = uVar11;
    local_2e8._16_8_ = opt->workspace_allocator;
    local_2e8._24_4_ = opt->openmp_blocktime;
    local_2e8[0x1c] = opt->use_winograd_convolution;
    local_2e8[0x1d] = opt->use_sgemm_convolution;
    local_2e8[0x1e] = opt->use_int8_inference;
    local_2e8[0x1f] = opt->use_vulkan_compute;
    local_2e8[0x20] = opt->use_bf16_storage;
    local_2e8[0x21] = opt->use_fp16_packed;
    local_2e8[0x22] = opt->use_fp16_storage;
    local_2e8[0x23] = opt->use_fp16_arithmetic;
    local_2e8[0x24] = opt->use_int8_packed;
    local_2e8[0x25] = opt->use_int8_storage;
    local_2e8[0x26] = opt->use_int8_arithmetic;
    local_2e8[0x27] = opt->use_packing_layout;
    unique0x00006d08 = opt->use_shader_pack8;
    unique0x00006d09 = opt->use_subgroup_basic;
    unique0x00006d0a = opt->use_subgroup_vote;
    unique0x00006d0b = opt->use_subgroup_ballot;
    unique0x00006d0c = opt->use_subgroup_shuffle;
    unique0x00006d0d = opt->use_image_storage;
    unique0x00006d0e = opt->use_tensor_storage;
    unique0x00006d0f = opt->use_reserved_0;
    uStack_2b8._0_4_ = opt->flush_denormals;
    unique0x00006d14 = opt->use_local_pool_allocator;
    unique0x00006d15 = opt->use_shader_local_memory;
    unique0x00006d16 = opt->use_cooperative_matrix;
    unique0x00006d17 = opt->use_winograd23_convolution;
    unique0x00006d18 = opt->use_winograd43_convolution;
    unique0x00006d19 = opt->use_winograd63_convolution;
    unique0x00006d1a = opt->use_reserved_6;
    unique0x00006d1b = opt->use_reserved_7;
    unique0x00006d1c = opt->use_reserved_8;
    unique0x00006d1d = opt->use_reserved_9;
    unique0x00006d1e = opt->use_reserved_10;
    unique0x00006d1f = opt->use_reserved_11;
    local_2e8._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_168,&local_228,(Option *)local_2e8);
    piVar6 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_228.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_228.data != (undefined4 *)0x0) {
            free(local_228.data);
          }
        }
        else {
          (*(local_228.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pp_Var22 = this->_vptr_ConvolutionDepthWise_x86_avx;
  }
  local_228.cstep = 0;
  local_228.data = (void *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx + (long)pp_Var22[-3]),&local_168,
             &local_228,opt);
  iVar18 = local_228.w;
  iVar5 = local_228.elempack;
  iVar25 = -100;
  if ((local_228.data == (void *)0x0) || (lVar26 = (long)local_228.c, local_228.cstep * lVar26 == 0)
     ) goto LAB_004356fe;
  p_Var23 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar27 = (~((iVar27 + -1) * iVar29) + local_228.w) / *(int *)(&this->field_0xe4 + (long)p_Var23);
  iVar29 = iVar27 + 1;
  uVar41 = (long)(~((iVar35 + -1) * iVar3) + local_228.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var23);
  local_230 = uVar41 & 0xffffffff;
  iVar35 = (int)uVar41 + 1;
  uVar28 = local_228.elempack * local_228.c;
  if ((uVar28 == *(uint *)(&this->field_0x108 + (long)p_Var23)) &&
     (uVar28 == *(uint *)(&this->field_0xd0 + (long)p_Var23))) {
    uVar21 = 8;
    if (opt->use_packing_layout == false) {
      uVar21 = 1;
    }
    if ((uVar28 & 7) != 0) {
      uVar21 = 1;
    }
    opt_00 = (Option *)(ulong)uVar21;
    iVar3 = *(int *)(&this->field_0x10c + (long)p_Var23);
    _elemsize = (Option *)(ulong)(uVar21 * 4);
    if (100 < iVar3) {
      _elemsize = opt_00;
    }
    Mat::create(top_blob,iVar29,iVar35,(int)uVar28 / (int)uVar21,(size_t)_elemsize,uVar21,
                opt->blob_allocator);
    iVar25 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_004356fe;
    iVar25 = 0;
    if (iVar5 == 1) {
      pp_Var22 = this->_vptr_ConvolutionDepthWise_x86_avx;
      p_Var23 = pp_Var22[-3];
      iVar35 = *(int *)(&this->field_0xd8 + (long)p_Var23);
      if (iVar35 == 3 && *(int *)(&this->field_0xd4 + (long)p_Var23) == 3) {
        if ((((*(int *)(&this->field_0xe4 + (long)p_Var23) == 1) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var23) == 1)) &&
            (*(int *)(&this->field_0xdc + (long)p_Var23) == 1)) &&
           ((*(int *)(&this->field_0xe0 + (long)p_Var23) == 1 &&
            (*(uint *)(&this->field_0x110 + (long)p_Var23) < 2)))) {
          if (iVar3 < 0x65) {
            local_2e8._0_16_ = (undefined1  [16])0x0;
            local_2e8._16_8_ = (Allocator *)0x0;
            p_Var23 = pp_Var22[-3];
            if (0 < *(int *)(&this->field_0x108 + (long)p_Var23)) {
              lVar26 = 0;
              do {
                fVar30 = 1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) +
                                          lVar26 * 4) *
                               *(float *)(*(long *)(&this->field_0x240 + (long)p_Var23) + lVar26 * 4
                                         ));
                local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar30);
                if (local_2e8._8_8_ == local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,
                             (iterator)local_2e8._8_8_,(float *)&local_278);
                }
                else {
                  *(float *)local_2e8._8_8_ = fVar30;
                  local_2e8._8_8_ = (float *)(local_2e8._8_8_ + 4);
                }
                lVar26 = lVar26 + 1;
                p_Var23 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
              } while (lVar26 < *(int *)(&this->field_0x108 + (long)p_Var23));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)local_2e8);
            convdw3x3s1_int8_dequant_sse
                      (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var23),&local_a8,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          else {
            local_2e8._0_16_ = (undefined1  [16])0x0;
            local_2e8._16_8_ = (Allocator *)0x0;
            p_Var23 = pp_Var22[-3];
            if (0 < *(int *)(&this->field_0x108 + (long)p_Var23)) {
              lVar26 = 0;
              do {
                fVar30 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) + lVar26 * 4);
                fVar43 = 0.0;
                if (fVar30 != 0.0) {
                  fVar43 = 1.0 / (fVar30 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var23)
                                                     + lVar26 * 4));
                }
                local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar43);
                local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,
                                              *(undefined4 *)
                                               (*(long *)(&this->field_0x288 + (long)p_Var23) +
                                               lVar26 * 4));
                if (local_2e8._8_8_ == local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,
                             (iterator)local_2e8._8_8_,(float *)&local_278);
                  iVar31._M_current = (float *)local_2e8._8_8_;
                }
                else {
                  *(float *)local_2e8._8_8_ = fVar43;
                  iVar31._M_current = (float *)(local_2e8._8_8_ + 4);
                  local_2e8._8_8_ = iVar31._M_current;
                }
                if (iVar31._M_current == (float *)local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,iVar31,
                             (float *)&local_1c8);
                }
                else {
                  *iVar31._M_current = local_1c8._0_4_;
                  local_2e8._8_8_ = iVar31._M_current + 1;
                }
                lVar26 = lVar26 + 1;
                p_Var23 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
              } while (lVar26 < *(int *)(&this->field_0x108 + (long)p_Var23));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)local_2e8);
            convdw3x3s1_int8_requant_sse
                      (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var23),&local_90,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
        }
        else {
          iVar35 = 3;
          if ((((*(int *)(&this->field_0xdc + (long)p_Var23) != 1) ||
               ((*(int *)(&this->field_0xe0 + (long)p_Var23) != 1 ||
                (*(int *)(&this->field_0xe4 + (long)p_Var23) != 2)))) ||
              (*(int *)(&this->field_0xe8 + (long)p_Var23) != 2)) ||
             (1 < *(uint *)(&this->field_0x110 + (long)p_Var23))) goto LAB_0043514f;
          if (iVar3 < 0x65) {
            local_2e8._0_16_ = (undefined1  [16])0x0;
            local_2e8._16_8_ = (Allocator *)0x0;
            p_Var23 = pp_Var22[-3];
            if (0 < *(int *)(&this->field_0x108 + (long)p_Var23)) {
              lVar26 = 0;
              do {
                fVar30 = 1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) +
                                          lVar26 * 4) *
                               *(float *)(*(long *)(&this->field_0x240 + (long)p_Var23) + lVar26 * 4
                                         ));
                local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar30);
                if (local_2e8._8_8_ == local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,
                             (iterator)local_2e8._8_8_,(float *)&local_278);
                }
                else {
                  *(float *)local_2e8._8_8_ = fVar30;
                  local_2e8._8_8_ = (float *)(local_2e8._8_8_ + 4);
                }
                lVar26 = lVar26 + 1;
                p_Var23 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
              } while (lVar26 < *(int *)(&this->field_0x108 + (long)p_Var23));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_d8,(vector<float,_std::allocator<float>_> *)local_2e8);
            convdw3x3s2_int8_dequant_sse
                      (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var23),&local_d8,opt_00);
          }
          else {
            local_2e8._0_16_ = (undefined1  [16])0x0;
            local_2e8._16_8_ = (Allocator *)0x0;
            p_Var23 = pp_Var22[-3];
            if (0 < *(int *)(&this->field_0x108 + (long)p_Var23)) {
              lVar26 = 0;
              do {
                fVar30 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) + lVar26 * 4);
                fVar43 = 0.0;
                if (fVar30 != 0.0) {
                  fVar43 = 1.0 / (fVar30 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var23)
                                                     + lVar26 * 4));
                }
                local_278.data = (void *)CONCAT44(local_278.data._4_4_,fVar43);
                local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,
                                              *(undefined4 *)
                                               (*(long *)(&this->field_0x288 + (long)p_Var23) +
                                               lVar26 * 4));
                if (local_2e8._8_8_ == local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,
                             (iterator)local_2e8._8_8_,(float *)&local_278);
                  iVar31._M_current = (float *)local_2e8._8_8_;
                }
                else {
                  *(float *)local_2e8._8_8_ = fVar43;
                  iVar31._M_current = (float *)(local_2e8._8_8_ + 4);
                  local_2e8._8_8_ = iVar31._M_current;
                }
                if (iVar31._M_current == (float *)local_2e8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2e8,iVar31,
                             (float *)&local_1c8);
                }
                else {
                  *iVar31._M_current = local_1c8._0_4_;
                  local_2e8._8_8_ = iVar31._M_current + 1;
                }
                lVar26 = lVar26 + 1;
                p_Var23 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
              } while (lVar26 < *(int *)(&this->field_0x108 + (long)p_Var23));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_c0,(vector<float,_std::allocator<float>_> *)local_2e8);
            convdw3x3s2_int8_requant_sse
                      (&local_228,top_blob,(Mat *)(this->weight_data_tm).data,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var23),&local_c0,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
        }
        if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ - local_2e8._0_8_);
        }
        pLVar9 = this->activation;
        if (pLVar9 != (Layer *)0x0) {
          (*pLVar9->_vptr_Layer[9])(pLVar9,top_blob,opt);
          iVar25 = 0;
          goto LAB_004356fe;
        }
      }
      else {
LAB_0043514f:
        uVar28 = iVar35 * *(int *)(&this->field_0xd4 + (long)p_Var23);
        local_178 = (size_type)(int)uVar28;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_2e8,local_178,
                   (allocator_type *)&local_278);
        uVar15 = local_2e8._0_8_;
        pp_Var22 = this->_vptr_ConvolutionDepthWise_x86_avx;
        p_Var23 = pp_Var22[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var23)) {
          iVar35 = *(int *)(&this->field_0xe0 + (long)p_Var23);
          iVar29 = *(int *)(&this->field_0xdc + (long)p_Var23);
          iVar5 = *(int *)(&this->field_0xd4 + (long)p_Var23);
          iVar25 = 0;
          fVar30 = 0.0;
          iVar33 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var23)) {
              lVar26 = 0;
              do {
                *(float *)(local_2e8._0_8_ + (iVar33 + lVar26) * 4) = fVar30;
                p_Var23 = pp_Var22[-3];
                fVar30 = (float)((int)fVar30 + *(int *)(&this->field_0xdc + (long)p_Var23));
                lVar26 = lVar26 + 1;
              } while ((int)lVar26 < *(int *)(&this->field_0xd4 + (long)p_Var23));
              iVar33 = iVar33 + (int)lVar26;
            }
            fVar30 = (float)((int)fVar30 + (iVar18 * iVar35 - iVar29 * iVar5));
            iVar25 = iVar25 + 1;
          } while (iVar25 < *(int *)(&this->field_0xd8 + (long)p_Var23));
        }
        pfVar32 = (pointer)local_2e8._0_8_;
        if (0 < *(int *)(&this->field_0x108 + (long)p_Var23)) {
          lVar26 = 0;
          auVar53 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          lVar39 = 0;
          local_288 = top_blob;
          local_180 = pp_Var22;
          do {
            pvVar7 = local_228.data;
            if (-1 < (int)local_230) {
              lVar36 = local_228.cstep * lVar39 * local_228.elemsize;
              local_310 = (float *)(local_288->elemsize * lVar39 * local_288->cstep +
                                   (long)local_288->data);
              local_290 = this->_vptr_ConvolutionDepthWise_x86_avx;
              lVar38 = (long)local_228.w * local_228.elemsize;
              pvVar8 = (this->weight_data_tm).data;
              local_1d8 = 0;
              local_2f0 = local_310;
              local_280 = lVar38;
              local_170 = lVar26;
              do {
                if (-1 < iVar27) {
                  local_298 = (ulong)(int)local_1d8;
                  iVar35 = 0;
                  do {
                    p_Var23 = local_290[-3];
                    fVar30 = 0.0;
                    fVar43 = 0.0;
                    if (0 < (int)uVar28) {
                      uVar41 = 0;
                      iVar29 = 0;
                      do {
                        iVar29 = iVar29 + (int)*(char *)((long)pvVar8 + uVar41 + lVar26) *
                                          (int)*(char *)((long)pvVar7 +
                                                        (long)(int)*(pointer)(uVar15 + uVar41 * 4) +
                                                        (long)*(int *)(&this->field_0xe8 +
                                                                      (long)p_Var23) * local_298 *
                                                        lVar38 + (long)iVar35 *
                                                                 (long)*(int *)(&this->field_0xe4 +
                                                                               (long)p_Var23) +
                                                                 lVar36);
                        uVar41 = uVar41 + 1;
                      } while (uVar28 != uVar41);
                      fVar43 = (float)iVar29;
                    }
                    fVar2 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) + lVar39 * 4);
                    if (fVar2 != 0.0) {
                      fVar30 = 1.0 / (fVar2 * *(float *)(*(long *)(&this->field_0x240 +
                                                                  (long)p_Var23) + lVar39 * 4));
                    }
                    fVar30 = fVar30 * fVar43;
                    if (*(int *)(&this->field_0x100 + (long)p_Var23) != 0) {
                      fVar30 = fVar30 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var23) +
                                                  lVar39 * 4);
                    }
                    auVar45 = ZEXT416((uint)fVar30);
                    fVar43 = fVar30;
                    switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var23)) {
                    case 1:
                      auVar45 = vmaxss_avx(auVar45,ZEXT416(0));
                      fVar43 = auVar45._0_4_;
                      break;
                    case 2:
                      auVar45 = vcmpss_avx(ZEXT816(0) << 0x40,auVar45,1);
                      auVar104._8_4_ = 0x3f800000;
                      auVar104._0_8_ = 0x3f8000003f800000;
                      auVar104._12_4_ = 0x3f800000;
                      auVar45 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var23
                                                                 )),auVar104,auVar45);
                      fVar44 = auVar45._0_4_;
LAB_004354c8:
                      fVar43 = fVar44 * fVar30;
                      break;
                    case 3:
                      fVar30 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var23))[1];
                      auVar45 = vmaxss_avx(auVar45,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                      (long)p_Var23)));
                      fVar43 = auVar45._0_4_;
                      if (fVar30 < auVar45._0_4_) {
                        fVar43 = fVar30;
                      }
                      break;
                    case 4:
                      auVar45 = vminss_avx(auVar45,ZEXT416(0x42b0c0a5));
                      auVar103._0_4_ = auVar45._0_4_ ^ auVar53._0_4_;
                      auVar103._4_4_ = auVar45._4_4_ ^ auVar53._4_4_;
                      auVar103._8_4_ = auVar45._8_4_ ^ auVar53._8_4_;
                      auVar103._12_4_ = auVar45._12_4_ ^ auVar53._12_4_;
                      auVar45 = vcmpss_avx(auVar45,ZEXT416(0xc2b0c0a5),1);
                      auVar109._8_4_ = 0x42b0c0a5;
                      auVar109._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar109._12_4_ = 0x42b0c0a5;
                      auVar45 = vblendvps_avx(auVar103,auVar109,auVar45);
                      fVar30 = expf(auVar45._0_4_);
                      auVar53 = ZEXT1664(CONCAT412(0x80000000,
                                                   CONCAT48(0x80000000,0x8000000080000000)));
                      lVar38 = local_280;
                      fVar43 = 1.0 / (fVar30 + 1.0);
                      break;
                    case 5:
                      local_1cc = fVar30;
                      fVar30 = expf(fVar30);
                      fVar30 = logf(fVar30 + 1.0);
                      fVar30 = tanhf(fVar30);
                      auVar53 = ZEXT1664(CONCAT412(0x80000000,
                                                   CONCAT48(0x80000000,0x8000000080000000)));
                      lVar38 = local_280;
                      fVar43 = fVar30 * local_1cc;
                      break;
                    case 6:
                      fVar2 = **(float **)(&this->field_0x118 + (long)p_Var23);
                      fVar44 = (*(float **)(&this->field_0x118 + (long)p_Var23))[1];
                      fVar96 = (float)((uint)fVar44 ^ auVar53._0_4_) / fVar2;
                      fVar43 = 0.0;
                      if ((fVar96 <= fVar30) && (fVar43 = fVar30, fVar30 <= fVar96 + 1.0 / fVar2)) {
                        fVar44 = fVar2 * fVar30 + fVar44;
                        goto LAB_004354c8;
                      }
                    }
                    if (iVar3 < 0x65) {
                      *local_310 = fVar43;
                      local_310 = local_310 + 1;
                    }
                    else {
                      fVar43 = fVar43 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var23) +
                                                  lVar39 * 4);
                      auVar45 = vandps_avx(ZEXT416((uint)fVar43),auVar53._0_16_);
                      auVar64._8_4_ = 0x3effffff;
                      auVar64._0_8_ = 0x3effffff3effffff;
                      auVar64._12_4_ = 0x3effffff;
                      auVar45 = vorps_avx(auVar45,auVar64);
                      auVar45 = ZEXT416((uint)(fVar43 + auVar45._0_4_));
                      auVar45 = vroundss_avx(auVar45,auVar45,0xb);
                      iVar29 = (int)auVar45._0_4_;
                      if (iVar29 < -0x7e) {
                        iVar29 = -0x7f;
                      }
                      uVar20 = (undefined1)iVar29;
                      if (0x7e < iVar29) {
                        uVar20 = 0x7f;
                      }
                      *(undefined1 *)local_2f0 = uVar20;
                      local_2f0 = (float *)((long)local_2f0 + 1);
                    }
                    bVar42 = iVar35 != iVar27;
                    iVar35 = iVar35 + 1;
                  } while (bVar42);
                }
                iVar35 = (int)local_1d8;
                local_1d8 = (ulong)(iVar35 + 1);
              } while (iVar35 != (int)local_230);
              p_Var23 = local_180[-3];
              lVar26 = local_170;
            }
            lVar39 = lVar39 + 1;
            lVar26 = lVar26 + local_178;
          } while (lVar39 < *(int *)(&this->field_0x108 + (long)p_Var23));
          pfVar32 = (pointer)local_2e8._0_8_;
        }
        if (pfVar32 != (pointer)0x0) {
          uVar41 = local_2e8._16_8_ - (long)pfVar32;
          goto LAB_00435611;
        }
      }
    }
    else {
      if (iVar5 != 8) goto LAB_004356fe;
      uVar41 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ) *
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             );
      local_280 = lVar26;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_2e8,uVar41,(allocator_type *)&local_278)
      ;
      pp_Var22 = this->_vptr_ConvolutionDepthWise_x86_avx;
      p_Var23 = pp_Var22[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var23)) {
        iVar35 = *(int *)(&this->field_0xe0 + (long)p_Var23);
        iVar29 = *(int *)(&this->field_0xdc + (long)p_Var23);
        iVar5 = *(int *)(&this->field_0xd4 + (long)p_Var23);
        iVar25 = 0;
        fVar30 = 0.0;
        iVar33 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var23)) {
            lVar26 = 0;
            do {
              *(float *)(local_2e8._0_8_ + (iVar25 + lVar26) * 4) = fVar30;
              p_Var23 = pp_Var22[-3];
              fVar30 = (float)((int)fVar30 + *(int *)(&this->field_0xdc + (long)p_Var23));
              lVar26 = lVar26 + 1;
            } while ((int)lVar26 < *(int *)(&this->field_0xd4 + (long)p_Var23));
            iVar25 = iVar25 + (int)lVar26;
          }
          fVar30 = (float)((int)fVar30 + (iVar18 * iVar35 - iVar29 * iVar5));
          iVar33 = iVar33 + 1;
        } while (iVar33 < *(int *)(&this->field_0xd8 + (long)p_Var23));
      }
      if (0 < (int)local_280) {
        local_298 = 0;
        auVar53 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar128 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        local_2f8 = 0;
        do {
          if (-1 < (int)local_230) {
            pauVar34 = (undefined1 (*) [16])
                       (top_blob->elemsize * local_2f8 * top_blob->cstep + (long)top_blob->data);
            pp_Var22 = this->_vptr_ConvolutionDepthWise_x86_avx;
            pvVar7 = (this->weight_data_tm).data;
            pp_Var19 = (_func_int **)0x0;
            pauVar37 = pauVar34;
            do {
              local_290 = pp_Var19;
              iVar35 = (int)local_290;
              if (-1 < iVar27) {
                iVar29 = 0;
                do {
                  p_Var23 = pp_Var22[-3];
                  if ((int)uVar41 < 1) {
                    auVar103 = ZEXT816(0) << 0x40;
                    auVar45 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar71 = ZEXT1664((undefined1  [16])0x0);
                    uVar40 = 0;
                    auVar78 = ZEXT1664((undefined1  [16])0x0);
                    do {
                      auVar80._8_8_ = 0;
                      auVar80._0_8_ =
                           *(ulong *)((long)local_228.data +
                                     (long)(int)*(pointer)(local_2e8._0_8_ + uVar40 * 4) * 8 +
                                     (long)*(int *)(&this->field_0xe8 + (long)p_Var23) *
                                     (long)iVar35 * (long)local_228.w * local_228.elemsize +
                                     (long)(*(int *)(&this->field_0xe4 + (long)p_Var23) * iVar29 * 8
                                           ) + local_228.cstep * local_2f8 * local_228.elemsize);
                      auVar45 = vpcmpgtb_avx((undefined1  [16])0x0,auVar80);
                      auVar103 = vpunpcklbw_avx(auVar80,auVar45);
                      auVar99._8_8_ = 0;
                      auVar99._0_8_ = *(ulong *)((long)pvVar7 + uVar40 * 8 + (long)(int)local_298);
                      auVar45 = vpcmpgtb_avx((undefined1  [16])0x0,auVar99);
                      auVar45 = vpunpcklbw_avx(auVar99,auVar45);
                      auVar109 = vpmullw_avx(auVar45,auVar103);
                      auVar103 = vpmulhw_avx(auVar103,auVar45);
                      auVar45 = vpunpcklwd_avx(auVar109,auVar103);
                      auVar45 = vpaddd_avx(auVar71._0_16_,auVar45);
                      auVar71 = ZEXT1664(auVar45);
                      auVar103 = vpunpckhwd_avx(auVar109,auVar103);
                      auVar103 = vpaddd_avx(auVar78._0_16_,auVar103);
                      auVar78 = ZEXT1664(auVar103);
                      uVar40 = uVar40 + 1;
                    } while ((uVar41 & 0xffffffff) != uVar40);
                    auVar45 = vcvtdq2ps_avx(auVar45);
                    auVar103 = vcvtdq2ps_avx(auVar103);
                  }
                  auVar109 = *(undefined1 (*) [16])
                              (*(long *)(&this->field_0x1f8 + (long)p_Var23) + local_2f8 * 0x20);
                  auVar104 = *(undefined1 (*) [16])
                              (*(long *)(&this->field_0x1f8 + (long)p_Var23) + 0x10 +
                              local_2f8 * 0x20);
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var23) +
                                    local_2f8 * 0x20);
                  auVar100._0_4_ = auVar109._0_4_ * *pfVar1;
                  auVar100._4_4_ = auVar109._4_4_ * pfVar1[1];
                  auVar100._8_4_ = auVar109._8_4_ * pfVar1[2];
                  auVar100._12_4_ = auVar109._12_4_ * pfVar1[3];
                  auVar64 = vrcpps_avx(auVar100);
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var23) + 0x10 +
                                    local_2f8 * 0x20);
                  auVar117._0_4_ = auVar104._0_4_ * *pfVar1;
                  auVar117._4_4_ = auVar104._4_4_ * pfVar1[1];
                  auVar117._8_4_ = auVar104._8_4_ * pfVar1[2];
                  auVar117._12_4_ = auVar104._12_4_ * pfVar1[3];
                  auVar80 = vrcpps_avx(auVar117);
                  auVar109 = vcmpps_avx(auVar109,(undefined1  [16])0x0,4);
                  auVar109 = vandps_avx(auVar109,auVar64);
                  auVar65._0_4_ = auVar109._0_4_ * auVar45._0_4_;
                  auVar65._4_4_ = auVar109._4_4_ * auVar45._4_4_;
                  auVar65._8_4_ = auVar109._8_4_ * auVar45._8_4_;
                  auVar65._12_4_ = auVar109._12_4_ * auVar45._12_4_;
                  auVar45 = vcmpps_avx(auVar104,(undefined1  [16])0x0,4);
                  auVar45 = vandps_avx(auVar45,auVar80);
                  auVar72._0_4_ = auVar45._0_4_ * auVar103._0_4_;
                  auVar72._4_4_ = auVar45._4_4_ * auVar103._4_4_;
                  auVar72._8_4_ = auVar45._8_4_ * auVar103._8_4_;
                  auVar72._12_4_ = auVar45._12_4_ * auVar103._12_4_;
                  if (*(int *)(&this->field_0x100 + (long)p_Var23) != 0) {
                    pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var23) +
                                      local_2f8 * 0x20);
                    auVar65._0_4_ = auVar65._0_4_ + *pfVar1;
                    auVar65._4_4_ = auVar65._4_4_ + pfVar1[1];
                    auVar65._8_4_ = auVar65._8_4_ + pfVar1[2];
                    auVar65._12_4_ = auVar65._12_4_ + pfVar1[3];
                    pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var23) + 0x10 +
                                      local_2f8 * 0x20);
                    auVar72._0_4_ = auVar72._0_4_ + *pfVar1;
                    auVar72._4_4_ = auVar72._4_4_ + pfVar1[1];
                    auVar72._8_4_ = auVar72._8_4_ + pfVar1[2];
                    auVar72._12_4_ = auVar72._12_4_ + pfVar1[3];
                  }
                  auVar45 = auVar128._0_16_;
                  fVar30 = auVar65._0_4_;
                  fVar43 = auVar65._4_4_;
                  fVar96 = auVar65._8_4_;
                  fVar98 = auVar65._12_4_;
                  fVar2 = auVar72._4_4_;
                  fVar44 = auVar72._8_4_;
                  fVar10 = auVar72._12_4_;
                  fVar127 = auVar128._0_4_;
                  fVar129 = auVar128._4_4_;
                  fVar130 = auVar128._8_4_;
                  fVar131 = auVar128._12_4_;
                  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var23)) {
                  case 1:
                    auVar65 = vmaxps_avx(auVar65,(undefined1  [16])0x0);
                    auVar72 = vmaxps_avx(auVar72,(undefined1  [16])0x0);
                    break;
                  case 2:
                    auVar45 = vmaxps_avx(auVar65,(undefined1  [16])0x0);
                    auVar103 = vminps_avx(auVar65,(undefined1  [16])0x0);
                    fVar30 = **(float **)(&this->field_0x118 + (long)p_Var23);
                    auVar65._0_4_ = fVar30 * auVar103._0_4_ + auVar45._0_4_;
                    auVar65._4_4_ = fVar30 * auVar103._4_4_ + auVar45._4_4_;
                    auVar65._8_4_ = fVar30 * auVar103._8_4_ + auVar45._8_4_;
                    auVar65._12_4_ = fVar30 * auVar103._12_4_ + auVar45._12_4_;
                    auVar45 = vmaxps_avx(auVar72,(undefined1  [16])0x0);
                    auVar103 = vminps_avx(auVar72,(undefined1  [16])0x0);
                    auVar72._0_4_ = fVar30 * auVar103._0_4_ + auVar45._0_4_;
                    auVar72._4_4_ = fVar30 * auVar103._4_4_ + auVar45._4_4_;
                    auVar72._8_4_ = fVar30 * auVar103._8_4_ + auVar45._8_4_;
                    auVar72._12_4_ = fVar30 * auVar103._12_4_ + auVar45._12_4_;
                    break;
                  case 3:
                    uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var23);
                    auVar88._4_4_ = uVar4;
                    auVar88._0_4_ = uVar4;
                    auVar88._8_4_ = uVar4;
                    auVar88._12_4_ = uVar4;
                    uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var23))[1];
                    auVar112._4_4_ = uVar4;
                    auVar112._0_4_ = uVar4;
                    auVar112._8_4_ = uVar4;
                    auVar112._12_4_ = uVar4;
                    auVar45 = vmaxps_avx(auVar65,auVar88);
                    auVar65 = vminps_avx(auVar45,auVar112);
                    auVar45 = vmaxps_avx(auVar72,auVar88);
                    auVar72 = vminps_avx(auVar45,auVar112);
                    break;
                  case 4:
                    auVar66._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
                    auVar66._8_4_ = -fVar96;
                    auVar66._12_4_ = -fVar98;
                    auVar132._8_4_ = 0x42b0c0a5;
                    auVar132._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar132._12_4_ = 0x42b0c0a5;
                    auVar103 = vminps_avx(auVar132,auVar66);
                    auVar135._8_4_ = 0xc2b0c0a5;
                    auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar135._12_4_ = 0xc2b0c0a5;
                    auVar104 = vmaxps_avx(auVar135,auVar103);
                    auVar89._0_4_ = auVar104._0_4_ * 1.442695 + auVar53._0_4_;
                    auVar89._4_4_ = auVar104._4_4_ * 1.442695 + auVar53._4_4_;
                    auVar89._8_4_ = auVar104._8_4_ * 1.442695 + auVar53._8_4_;
                    auVar89._12_4_ = auVar104._12_4_ * 1.442695 + auVar53._12_4_;
                    auVar113._0_4_ = (int)auVar89._0_4_;
                    auVar113._4_4_ = (int)auVar89._4_4_;
                    auVar113._8_4_ = (int)auVar89._8_4_;
                    auVar113._12_4_ = (int)auVar89._12_4_;
                    auVar109 = vcvtdq2ps_avx(auVar113);
                    auVar103 = vcmpps_avx(auVar89,auVar109,1);
                    auVar103 = vandps_avx(auVar45,auVar103);
                    auVar103 = vsubps_avx(auVar109,auVar103);
                    auVar114._0_4_ = auVar103._0_4_ * 0.6931472;
                    auVar114._4_4_ = auVar103._4_4_ * 0.6931472;
                    auVar114._8_4_ = auVar103._8_4_ * 0.6931472;
                    auVar114._12_4_ = auVar103._12_4_ * 0.6931472;
                    auVar109 = vsubps_avx(auVar104,auVar114);
                    fVar30 = auVar109._0_4_;
                    fVar43 = auVar109._4_4_;
                    fVar2 = auVar109._8_4_;
                    fVar96 = auVar109._12_4_;
                    auVar128 = ZEXT1664(auVar45);
                    auVar90._0_4_ = (int)auVar103._0_4_;
                    auVar90._4_4_ = (int)auVar103._4_4_;
                    auVar90._8_4_ = (int)auVar103._8_4_;
                    auVar90._12_4_ = (int)auVar103._12_4_;
                    auVar103 = vpslld_avx(auVar90,0x17);
                    auVar103 = vpaddd_avx(auVar45,auVar103);
                    auVar67._0_4_ =
                         fVar127 + (fVar127 + fVar30 +
                                   fVar30 * fVar30 *
                                   (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 +
                                      0.008333452) * fVar30 + 0.041665796) * fVar30 + 0.16666666) *
                                    fVar30 + 0.5)) * auVar103._0_4_;
                    auVar67._4_4_ =
                         fVar129 + (fVar129 + fVar43 +
                                   fVar43 * fVar43 *
                                   (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 +
                                      0.008333452) * fVar43 + 0.041665796) * fVar43 + 0.16666666) *
                                    fVar43 + 0.5)) * auVar103._4_4_;
                    auVar67._8_4_ =
                         fVar130 + (fVar130 + fVar2 +
                                   fVar2 * fVar2 *
                                   (((((fVar2 * 0.00019875691 + 0.0013981999) * fVar2 + 0.008333452)
                                      * fVar2 + 0.041665796) * fVar2 + 0.16666666) * fVar2 + 0.5)) *
                                   auVar103._8_4_;
                    auVar67._12_4_ =
                         fVar131 + (fVar131 + fVar96 +
                                   fVar96 * fVar96 *
                                   (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 +
                                      0.008333452) * fVar96 + 0.041665796) * fVar96 + 0.16666666) *
                                    fVar96 + 0.5)) * auVar103._12_4_;
                    auVar103 = vrcpps_avx(auVar67);
                    fVar30 = auVar103._0_4_;
                    auVar68._0_4_ = auVar67._0_4_ * fVar30;
                    fVar43 = auVar103._4_4_;
                    auVar68._4_4_ = auVar67._4_4_ * fVar43;
                    fVar2 = auVar103._8_4_;
                    auVar68._8_4_ = auVar67._8_4_ * fVar2;
                    fVar96 = auVar103._12_4_;
                    auVar68._12_4_ = auVar67._12_4_ * fVar96;
                    auVar103 = vsubps_avx(auVar45,auVar68);
                    auVar65._0_4_ = fVar30 + fVar30 * auVar103._0_4_;
                    auVar65._4_4_ = fVar43 + fVar43 * auVar103._4_4_;
                    auVar65._8_4_ = fVar2 + fVar2 * auVar103._8_4_;
                    auVar65._12_4_ = fVar96 + fVar96 * auVar103._12_4_;
                    auVar73._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
                    auVar73._8_4_ = -fVar44;
                    auVar73._12_4_ = -fVar10;
                    auVar103 = vminps_avx(auVar132,auVar73);
                    auVar104 = vmaxps_avx(auVar135,auVar103);
                    auVar91._0_4_ = auVar104._0_4_ * 1.442695 + 0.5;
                    auVar91._4_4_ = auVar104._4_4_ * 1.442695 + 0.5;
                    auVar91._8_4_ = auVar104._8_4_ * 1.442695 + 0.5;
                    auVar91._12_4_ = auVar104._12_4_ * 1.442695 + 0.5;
                    auVar115._0_4_ = (int)auVar91._0_4_;
                    auVar115._4_4_ = (int)auVar91._4_4_;
                    auVar115._8_4_ = (int)auVar91._8_4_;
                    auVar115._12_4_ = (int)auVar91._12_4_;
                    auVar109 = vcvtdq2ps_avx(auVar115);
                    auVar103 = vcmpps_avx(auVar91,auVar109,1);
                    auVar103 = vandps_avx(auVar45,auVar103);
                    auVar103 = vsubps_avx(auVar109,auVar103);
                    auVar116._0_4_ = auVar103._0_4_ * 0.6931472;
                    auVar116._4_4_ = auVar103._4_4_ * 0.6931472;
                    auVar116._8_4_ = auVar103._8_4_ * 0.6931472;
                    auVar116._12_4_ = auVar103._12_4_ * 0.6931472;
                    auVar53 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000))
                                      );
                    auVar109 = vsubps_avx(auVar104,auVar116);
                    fVar30 = auVar109._0_4_;
                    fVar43 = auVar109._4_4_;
                    fVar2 = auVar109._8_4_;
                    fVar44 = auVar109._12_4_;
                    auVar92._0_4_ = (int)auVar103._0_4_;
                    auVar92._4_4_ = (int)auVar103._4_4_;
                    auVar92._8_4_ = (int)auVar103._8_4_;
                    auVar92._12_4_ = (int)auVar103._12_4_;
                    auVar103 = vpslld_avx(auVar92,0x17);
                    auVar103 = vpaddd_avx(auVar45,auVar103);
                    auVar74._0_4_ =
                         fVar127 + (fVar127 + fVar30 +
                                   fVar30 * fVar30 *
                                   (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 +
                                      0.008333452) * fVar30 + 0.041665796) * fVar30 + 0.16666666) *
                                    fVar30 + 0.5)) * auVar103._0_4_;
                    auVar74._4_4_ =
                         fVar129 + (fVar129 + fVar43 +
                                   fVar43 * fVar43 *
                                   (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 +
                                      0.008333452) * fVar43 + 0.041665796) * fVar43 + 0.16666666) *
                                    fVar43 + 0.5)) * auVar103._4_4_;
                    auVar74._8_4_ =
                         fVar130 + (fVar130 + fVar2 +
                                   fVar2 * fVar2 *
                                   (((((fVar2 * 0.00019875691 + 0.0013981999) * fVar2 + 0.008333452)
                                      * fVar2 + 0.041665796) * fVar2 + 0.16666666) * fVar2 + 0.5)) *
                                   auVar103._8_4_;
                    auVar74._12_4_ =
                         fVar131 + (fVar131 + fVar44 +
                                   fVar44 * fVar44 *
                                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 +
                                      0.008333452) * fVar44 + 0.041665796) * fVar44 + 0.16666666) *
                                    fVar44 + 0.5)) * auVar103._12_4_;
                    auVar103 = vrcpps_avx(auVar74);
                    fVar30 = auVar103._0_4_;
                    auVar75._0_4_ = auVar74._0_4_ * fVar30;
                    fVar43 = auVar103._4_4_;
                    auVar75._4_4_ = auVar74._4_4_ * fVar43;
                    fVar2 = auVar103._8_4_;
                    auVar75._8_4_ = auVar74._8_4_ * fVar2;
                    fVar44 = auVar103._12_4_;
                    auVar75._12_4_ = auVar74._12_4_ * fVar44;
                    auVar45 = vsubps_avx(auVar45,auVar75);
                    auVar72._0_4_ = fVar30 + fVar30 * auVar45._0_4_;
                    auVar72._4_4_ = fVar43 + fVar43 * auVar45._4_4_;
                    auVar72._8_4_ = fVar2 + fVar2 * auVar45._8_4_;
                    auVar72._12_4_ = fVar44 + fVar44 * auVar45._12_4_;
                    break;
                  case 5:
                    auVar133._8_4_ = 0x42b0c0a5;
                    auVar133._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar133._12_4_ = 0x42b0c0a5;
                    auVar103 = vminps_avx(auVar133,auVar65);
                    auVar136._8_4_ = 0xc2b0c0a5;
                    auVar136._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar136._12_4_ = 0xc2b0c0a5;
                    auVar104 = vmaxps_avx(auVar136,auVar103);
                    auVar101._0_4_ = auVar104._0_4_ * 1.442695 + auVar53._0_4_;
                    auVar101._4_4_ = auVar104._4_4_ * 1.442695 + auVar53._4_4_;
                    auVar101._8_4_ = auVar104._8_4_ * 1.442695 + auVar53._8_4_;
                    auVar101._12_4_ = auVar104._12_4_ * 1.442695 + auVar53._12_4_;
                    auVar118._0_4_ = (int)auVar101._0_4_;
                    auVar118._4_4_ = (int)auVar101._4_4_;
                    auVar118._8_4_ = (int)auVar101._8_4_;
                    auVar118._12_4_ = (int)auVar101._12_4_;
                    auVar109 = vcvtdq2ps_avx(auVar118);
                    auVar103 = vcmpps_avx(auVar101,auVar109,1);
                    auVar103 = vandps_avx(auVar45,auVar103);
                    auVar103 = vsubps_avx(auVar109,auVar103);
                    auVar119._0_4_ = auVar103._0_4_ * 0.6931472;
                    auVar119._4_4_ = auVar103._4_4_ * 0.6931472;
                    auVar119._8_4_ = auVar103._8_4_ * 0.6931472;
                    auVar119._12_4_ = auVar103._12_4_ * 0.6931472;
                    auVar109 = vsubps_avx(auVar104,auVar119);
                    fVar79 = auVar109._0_4_;
                    fVar94 = auVar109._4_4_;
                    fVar95 = auVar109._8_4_;
                    fVar97 = auVar109._12_4_;
                    auVar102._0_4_ = (int)auVar103._0_4_;
                    auVar102._4_4_ = (int)auVar103._4_4_;
                    auVar102._8_4_ = (int)auVar103._8_4_;
                    auVar102._12_4_ = (int)auVar103._12_4_;
                    auVar103 = vpslld_avx(auVar102,0x17);
                    auVar103 = vpaddd_avx(auVar45,auVar103);
                    auVar81._0_4_ =
                         fVar127 + (fVar127 + fVar79 +
                                   (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 +
                                      0.008333452) * fVar79 + 0.041665796) * fVar79 + 0.16666666) *
                                    fVar79 + 0.5) * fVar79 * fVar79) * auVar103._0_4_;
                    auVar81._4_4_ =
                         fVar129 + (fVar129 + fVar94 +
                                   (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 +
                                      0.008333452) * fVar94 + 0.041665796) * fVar94 + 0.16666666) *
                                    fVar94 + 0.5) * fVar94 * fVar94) * auVar103._4_4_;
                    auVar81._8_4_ =
                         fVar130 + (fVar130 + fVar95 +
                                   (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 +
                                      0.008333452) * fVar95 + 0.041665796) * fVar95 + 0.16666666) *
                                    fVar95 + 0.5) * fVar95 * fVar95) * auVar103._8_4_;
                    auVar81._12_4_ =
                         fVar131 + (fVar131 + fVar97 +
                                   (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 +
                                      0.008333452) * fVar97 + 0.041665796) * fVar97 + 0.16666666) *
                                    fVar97 + 0.5) * fVar97 * fVar97) * auVar103._12_4_;
                    auVar109 = vcmpps_avx(auVar81,(undefined1  [16])0x0,2);
                    auVar54._8_4_ = 0x800000;
                    auVar54._0_8_ = 0x80000000800000;
                    auVar54._12_4_ = 0x800000;
                    auVar103 = vmaxps_avx(auVar81,auVar54);
                    auVar104 = vpsrld_avx(auVar103,0x17);
                    auVar55._8_4_ = 0x807fffff;
                    auVar55._0_8_ = 0x807fffff807fffff;
                    auVar55._12_4_ = 0x807fffff;
                    auVar103 = vandps_avx(auVar103,auVar55);
                    auVar56._8_4_ = 0x3f000000;
                    auVar56._0_8_ = 0x3f0000003f000000;
                    auVar56._12_4_ = 0x3f000000;
                    auVar80 = vorps_avx(auVar103,auVar56);
                    auVar57._8_4_ = 0xffffff82;
                    auVar57._0_8_ = 0xffffff82ffffff82;
                    auVar57._12_4_ = 0xffffff82;
                    auVar103 = vpaddd_avx(auVar104,auVar57);
                    auVar64 = vcvtdq2ps_avx(auVar103);
                    auVar58._8_4_ = 0x3f3504f3;
                    auVar58._0_8_ = 0x3f3504f33f3504f3;
                    auVar58._12_4_ = 0x3f3504f3;
                    auVar104 = vcmpps_avx(auVar80,auVar58,1);
                    auVar103 = vandps_avx(auVar104,auVar80);
                    fVar79 = auVar103._0_4_ + auVar80._0_4_ + -1.0;
                    fVar94 = auVar103._4_4_ + auVar80._4_4_ + -1.0;
                    fVar95 = auVar103._8_4_ + auVar80._8_4_ + -1.0;
                    fVar97 = auVar103._12_4_ + auVar80._12_4_ + -1.0;
                    auVar103 = vandps_avx(auVar45,auVar104);
                    auVar103 = vsubps_avx(auVar64,auVar103);
                    auVar82._0_4_ =
                         (auVar103._0_4_ * 0.6931472 + fVar79 +
                         (((((((((fVar79 * 0.070376836 + -0.1151461) * fVar79 + 0.116769984) *
                                fVar79 + -0.12420141) * fVar79 + 0.14249323) * fVar79 + -0.16668057)
                             * fVar79 + 0.20000714) * fVar79 + -0.24999994) * fVar79 + 0.3333333) *
                          fVar79 + -0.5) * fVar79 * fVar79) * -2.0;
                    auVar82._4_4_ =
                         (auVar103._4_4_ * 0.6931472 + fVar94 +
                         (((((((((fVar94 * 0.070376836 + -0.1151461) * fVar94 + 0.116769984) *
                                fVar94 + -0.12420141) * fVar94 + 0.14249323) * fVar94 + -0.16668057)
                             * fVar94 + 0.20000714) * fVar94 + -0.24999994) * fVar94 + 0.3333333) *
                          fVar94 + -0.5) * fVar94 * fVar94) * -2.0;
                    auVar82._8_4_ =
                         (auVar103._8_4_ * 0.6931472 + fVar95 +
                         (((((((((fVar95 * 0.070376836 + -0.1151461) * fVar95 + 0.116769984) *
                                fVar95 + -0.12420141) * fVar95 + 0.14249323) * fVar95 + -0.16668057)
                             * fVar95 + 0.20000714) * fVar95 + -0.24999994) * fVar95 + 0.3333333) *
                          fVar95 + -0.5) * fVar95 * fVar95) * -2.0;
                    auVar82._12_4_ =
                         (auVar103._12_4_ * 0.6931472 + fVar97 +
                         (((((((((fVar97 * 0.070376836 + -0.1151461) * fVar97 + 0.116769984) *
                                fVar97 + -0.12420141) * fVar97 + 0.14249323) * fVar97 + -0.16668057)
                             * fVar97 + 0.20000714) * fVar97 + -0.24999994) * fVar97 + 0.3333333) *
                          fVar97 + -0.5) * fVar97 * fVar97) * -2.0;
                    auVar59._8_4_ = 0x7fffffff;
                    auVar59._0_8_ = 0x7fffffff7fffffff;
                    auVar59._12_4_ = 0x7fffffff;
                    auVar103 = vblendvps_avx(auVar82,auVar59,auVar109);
                    auVar103 = vminps_avx(auVar133,auVar103);
                    auVar134._8_4_ = 0xc2b0c0a5;
                    auVar134._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar134._12_4_ = 0xc2b0c0a5;
                    auVar104 = vmaxps_avx(auVar134,auVar103);
                    auVar105._0_4_ = auVar104._0_4_ * 1.442695 + 0.5;
                    auVar105._4_4_ = auVar104._4_4_ * 1.442695 + 0.5;
                    auVar105._8_4_ = auVar104._8_4_ * 1.442695 + 0.5;
                    auVar105._12_4_ = auVar104._12_4_ * 1.442695 + 0.5;
                    auVar120._0_4_ = (int)auVar105._0_4_;
                    auVar120._4_4_ = (int)auVar105._4_4_;
                    auVar120._8_4_ = (int)auVar105._8_4_;
                    auVar120._12_4_ = (int)auVar105._12_4_;
                    auVar109 = vcvtdq2ps_avx(auVar120);
                    auVar103 = vcmpps_avx(auVar105,auVar109,1);
                    auVar103 = vandps_avx(auVar45,auVar103);
                    auVar103 = vsubps_avx(auVar109,auVar103);
                    auVar121._0_4_ = auVar103._0_4_ * 0.6931472;
                    auVar121._4_4_ = auVar103._4_4_ * 0.6931472;
                    auVar121._8_4_ = auVar103._8_4_ * 0.6931472;
                    auVar121._12_4_ = auVar103._12_4_ * 0.6931472;
                    auVar109 = vsubps_avx(auVar104,auVar121);
                    fVar79 = auVar109._0_4_;
                    fVar94 = auVar109._4_4_;
                    fVar95 = auVar109._8_4_;
                    fVar97 = auVar109._12_4_;
                    auVar106._0_4_ = (int)auVar103._0_4_;
                    auVar106._4_4_ = (int)auVar103._4_4_;
                    auVar106._8_4_ = (int)auVar103._8_4_;
                    auVar106._12_4_ = (int)auVar103._12_4_;
                    auVar103 = vpslld_avx(auVar106,0x17);
                    auVar103 = vpaddd_avx(auVar45,auVar103);
                    auVar83._0_4_ =
                         fVar127 + (fVar127 + fVar79 +
                                   (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 +
                                      0.008333452) * fVar79 + 0.041665796) * fVar79 + 0.16666666) *
                                    fVar79 + 0.5) * fVar79 * fVar79) * auVar103._0_4_;
                    auVar83._4_4_ =
                         fVar129 + (fVar129 + fVar94 +
                                   (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 +
                                      0.008333452) * fVar94 + 0.041665796) * fVar94 + 0.16666666) *
                                    fVar94 + 0.5) * fVar94 * fVar94) * auVar103._4_4_;
                    auVar83._8_4_ =
                         fVar130 + (fVar130 + fVar95 +
                                   (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 +
                                      0.008333452) * fVar95 + 0.041665796) * fVar95 + 0.16666666) *
                                    fVar95 + 0.5) * fVar95 * fVar95) * auVar103._8_4_;
                    auVar83._12_4_ =
                         fVar131 + (fVar131 + fVar97 +
                                   (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 +
                                      0.008333452) * fVar97 + 0.041665796) * fVar97 + 0.16666666) *
                                    fVar97 + 0.5) * fVar97 * fVar97) * auVar103._12_4_;
                    auVar103 = vrcpps_avx(auVar83);
                    fVar79 = auVar103._0_4_;
                    fVar94 = auVar103._4_4_;
                    fVar95 = auVar103._8_4_;
                    fVar97 = auVar103._12_4_;
                    auVar84._0_4_ = auVar83._0_4_ * (fVar79 + fVar79);
                    auVar84._4_4_ = auVar83._4_4_ * (fVar94 + fVar94);
                    auVar84._8_4_ = auVar83._8_4_ * (fVar95 + fVar95);
                    auVar84._12_4_ = auVar83._12_4_ * (fVar97 + fVar97);
                    auVar60._8_4_ = 0x40000000;
                    auVar60._0_8_ = 0x4000000040000000;
                    auVar60._12_4_ = 0x40000000;
                    auVar103 = vsubps_avx(auVar60,auVar84);
                    auVar65._0_4_ = (fVar79 + fVar79 + -1.0 + fVar79 * auVar103._0_4_) * fVar30;
                    auVar65._4_4_ = (fVar94 + fVar94 + -1.0 + fVar94 * auVar103._4_4_) * fVar43;
                    auVar65._8_4_ = (fVar95 + fVar95 + -1.0 + fVar95 * auVar103._8_4_) * fVar96;
                    auVar65._12_4_ = (fVar97 + fVar97 + -1.0 + fVar97 * auVar103._12_4_) * fVar98;
                    auVar103 = vminps_avx(auVar133,auVar72);
                    auVar104 = vmaxps_avx(auVar134,auVar103);
                    auVar107._0_4_ = auVar104._0_4_ * 1.442695 + 0.5;
                    auVar107._4_4_ = auVar104._4_4_ * 1.442695 + 0.5;
                    auVar107._8_4_ = auVar104._8_4_ * 1.442695 + 0.5;
                    auVar107._12_4_ = auVar104._12_4_ * 1.442695 + 0.5;
                    auVar122._0_4_ = (int)auVar107._0_4_;
                    auVar122._4_4_ = (int)auVar107._4_4_;
                    auVar122._8_4_ = (int)auVar107._8_4_;
                    auVar122._12_4_ = (int)auVar107._12_4_;
                    auVar109 = vcvtdq2ps_avx(auVar122);
                    auVar103 = vcmpps_avx(auVar107,auVar109,1);
                    auVar103 = vandps_avx(auVar45,auVar103);
                    auVar103 = vsubps_avx(auVar109,auVar103);
                    auVar123._0_4_ = auVar103._0_4_ * 0.6931472;
                    auVar123._4_4_ = auVar103._4_4_ * 0.6931472;
                    auVar123._8_4_ = auVar103._8_4_ * 0.6931472;
                    auVar123._12_4_ = auVar103._12_4_ * 0.6931472;
                    auVar109 = vsubps_avx(auVar104,auVar123);
                    fVar30 = auVar109._0_4_;
                    fVar43 = auVar109._4_4_;
                    fVar96 = auVar109._8_4_;
                    fVar98 = auVar109._12_4_;
                    auVar108._0_4_ = (int)auVar103._0_4_;
                    auVar108._4_4_ = (int)auVar103._4_4_;
                    auVar108._8_4_ = (int)auVar103._8_4_;
                    auVar108._12_4_ = (int)auVar103._12_4_;
                    auVar103 = vpslld_avx(auVar108,0x17);
                    auVar103 = vpaddd_avx(auVar45,auVar103);
                    auVar137._0_4_ =
                         fVar127 + (fVar127 + fVar30 +
                                   (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 +
                                      0.008333452) * fVar30 + 0.041665796) * fVar30 + 0.16666666) *
                                    fVar30 + 0.5) * fVar30 * fVar30) * auVar103._0_4_;
                    auVar137._4_4_ =
                         fVar129 + (fVar129 + fVar43 +
                                   (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 +
                                      0.008333452) * fVar43 + 0.041665796) * fVar43 + 0.16666666) *
                                    fVar43 + 0.5) * fVar43 * fVar43) * auVar103._4_4_;
                    auVar137._8_4_ =
                         fVar130 + (fVar130 + fVar96 +
                                   (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 +
                                      0.008333452) * fVar96 + 0.041665796) * fVar96 + 0.16666666) *
                                    fVar96 + 0.5) * fVar96 * fVar96) * auVar103._8_4_;
                    auVar137._12_4_ =
                         fVar131 + (fVar131 + fVar98 +
                                   (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 +
                                      0.008333452) * fVar98 + 0.041665796) * fVar98 + 0.16666666) *
                                    fVar98 + 0.5) * fVar98 * fVar98) * auVar103._12_4_;
                    auVar46._8_4_ = 0x800000;
                    auVar46._0_8_ = 0x80000000800000;
                    auVar46._12_4_ = 0x800000;
                    auVar103 = vmaxps_avx(auVar137,auVar46);
                    auVar109 = vpsrld_avx(auVar103,0x17);
                    auVar47._8_4_ = 0x807fffff;
                    auVar47._0_8_ = 0x807fffff807fffff;
                    auVar47._12_4_ = 0x807fffff;
                    auVar103 = vandps_avx(auVar103,auVar47);
                    auVar61._8_4_ = 0x3f000000;
                    auVar61._0_8_ = 0x3f0000003f000000;
                    auVar61._12_4_ = 0x3f000000;
                    auVar64 = vorps_avx(auVar103,auVar61);
                    auVar48._8_4_ = 0xffffff82;
                    auVar48._0_8_ = 0xffffff82ffffff82;
                    auVar48._12_4_ = 0xffffff82;
                    auVar103 = vpaddd_avx(auVar109,auVar48);
                    auVar104 = vcvtdq2ps_avx(auVar103);
                    auVar49._8_4_ = 0x3f3504f3;
                    auVar49._0_8_ = 0x3f3504f33f3504f3;
                    auVar49._12_4_ = 0x3f3504f3;
                    auVar109 = vcmpps_avx(auVar64,auVar49,1);
                    auVar103 = vandps_avx(auVar109,auVar64);
                    fVar30 = auVar103._0_4_ + auVar64._0_4_ + -1.0;
                    fVar43 = auVar103._4_4_ + auVar64._4_4_ + -1.0;
                    fVar96 = auVar103._8_4_ + auVar64._8_4_ + -1.0;
                    fVar98 = auVar103._12_4_ + auVar64._12_4_ + -1.0;
                    auVar103 = vandps_avx(auVar45,auVar109);
                    auVar109 = vsubps_avx(auVar104,auVar103);
                    auVar103 = vcmpps_avx(auVar137,(undefined1  [16])0x0,2);
                    auVar85._0_4_ =
                         (auVar109._0_4_ * 0.6931472 + fVar30 +
                         (((((((((fVar30 * 0.070376836 + -0.1151461) * fVar30 + 0.116769984) *
                                fVar30 + -0.12420141) * fVar30 + 0.14249323) * fVar30 + -0.16668057)
                             * fVar30 + 0.20000714) * fVar30 + -0.24999994) * fVar30 + 0.3333333) *
                          fVar30 + -0.5) * fVar30 * fVar30) * -2.0;
                    auVar85._4_4_ =
                         (auVar109._4_4_ * 0.6931472 + fVar43 +
                         (((((((((fVar43 * 0.070376836 + -0.1151461) * fVar43 + 0.116769984) *
                                fVar43 + -0.12420141) * fVar43 + 0.14249323) * fVar43 + -0.16668057)
                             * fVar43 + 0.20000714) * fVar43 + -0.24999994) * fVar43 + 0.3333333) *
                          fVar43 + -0.5) * fVar43 * fVar43) * -2.0;
                    auVar85._8_4_ =
                         (auVar109._8_4_ * 0.6931472 + fVar96 +
                         (((((((((fVar96 * 0.070376836 + -0.1151461) * fVar96 + 0.116769984) *
                                fVar96 + -0.12420141) * fVar96 + 0.14249323) * fVar96 + -0.16668057)
                             * fVar96 + 0.20000714) * fVar96 + -0.24999994) * fVar96 + 0.3333333) *
                          fVar96 + -0.5) * fVar96 * fVar96) * -2.0;
                    auVar85._12_4_ =
                         (auVar109._12_4_ * 0.6931472 + fVar98 +
                         (((((((((fVar98 * 0.070376836 + -0.1151461) * fVar98 + 0.116769984) *
                                fVar98 + -0.12420141) * fVar98 + 0.14249323) * fVar98 + -0.16668057)
                             * fVar98 + 0.20000714) * fVar98 + -0.24999994) * fVar98 + 0.3333333) *
                          fVar98 + -0.5) * fVar98 * fVar98) * -2.0;
                    auVar50._8_4_ = 0x7fffffff;
                    auVar50._0_8_ = 0x7fffffff7fffffff;
                    auVar50._12_4_ = 0x7fffffff;
                    auVar103 = vblendvps_avx(auVar85,auVar50,auVar103);
                    auVar51._8_4_ = 0x42b0c0a5;
                    auVar51._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar51._12_4_ = 0x42b0c0a5;
                    auVar103 = vminps_avx(auVar103,auVar51);
                    auVar52._8_4_ = 0xc2b0c0a5;
                    auVar52._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar52._12_4_ = 0xc2b0c0a5;
                    auVar104 = vmaxps_avx(auVar103,auVar52);
                    auVar110._0_4_ = auVar104._0_4_ * 1.442695 + 0.5;
                    auVar110._4_4_ = auVar104._4_4_ * 1.442695 + 0.5;
                    auVar110._8_4_ = auVar104._8_4_ * 1.442695 + 0.5;
                    auVar110._12_4_ = auVar104._12_4_ * 1.442695 + 0.5;
                    auVar124._0_4_ = (int)auVar110._0_4_;
                    auVar124._4_4_ = (int)auVar110._4_4_;
                    auVar124._8_4_ = (int)auVar110._8_4_;
                    auVar124._12_4_ = (int)auVar110._12_4_;
                    auVar109 = vcvtdq2ps_avx(auVar124);
                    auVar103 = vcmpps_avx(auVar110,auVar109,1);
                    auVar103 = vandps_avx(auVar45,auVar103);
                    auVar103 = vsubps_avx(auVar109,auVar103);
                    auVar125._0_4_ = auVar103._0_4_ * 0.6931472;
                    auVar125._4_4_ = auVar103._4_4_ * 0.6931472;
                    auVar125._8_4_ = auVar103._8_4_ * 0.6931472;
                    auVar125._12_4_ = auVar103._12_4_ * 0.6931472;
                    auVar53 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000))
                                      );
                    auVar109 = vsubps_avx(auVar104,auVar125);
                    fVar30 = auVar109._0_4_;
                    fVar43 = auVar109._4_4_;
                    fVar96 = auVar109._8_4_;
                    fVar98 = auVar109._12_4_;
                    auVar111._0_4_ = (int)auVar103._0_4_;
                    auVar111._4_4_ = (int)auVar103._4_4_;
                    auVar111._8_4_ = (int)auVar103._8_4_;
                    auVar111._12_4_ = (int)auVar103._12_4_;
                    auVar103 = vpslld_avx(auVar111,0x17);
                    auVar45 = vpaddd_avx(auVar45,auVar103);
                    auVar86._0_4_ =
                         fVar127 + (fVar127 + fVar30 +
                                   (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 +
                                      0.008333452) * fVar30 + 0.041665796) * fVar30 + 0.16666666) *
                                    fVar30 + 0.5) * fVar30 * fVar30) * auVar45._0_4_;
                    auVar86._4_4_ =
                         fVar129 + (fVar129 + fVar43 +
                                   (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 +
                                      0.008333452) * fVar43 + 0.041665796) * fVar43 + 0.16666666) *
                                    fVar43 + 0.5) * fVar43 * fVar43) * auVar45._4_4_;
                    auVar86._8_4_ =
                         fVar130 + (fVar130 + fVar96 +
                                   (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 +
                                      0.008333452) * fVar96 + 0.041665796) * fVar96 + 0.16666666) *
                                    fVar96 + 0.5) * fVar96 * fVar96) * auVar45._8_4_;
                    auVar86._12_4_ =
                         fVar131 + (fVar131 + fVar98 +
                                   (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 +
                                      0.008333452) * fVar98 + 0.041665796) * fVar98 + 0.16666666) *
                                    fVar98 + 0.5) * fVar98 * fVar98) * auVar45._12_4_;
                    auVar45 = vrcpps_avx(auVar86);
                    fVar30 = auVar45._0_4_;
                    fVar43 = auVar45._4_4_;
                    fVar96 = auVar45._8_4_;
                    fVar98 = auVar45._12_4_;
                    auVar87._0_4_ = auVar86._0_4_ * (fVar30 + fVar30);
                    auVar87._4_4_ = auVar86._4_4_ * (fVar43 + fVar43);
                    auVar87._8_4_ = auVar86._8_4_ * (fVar96 + fVar96);
                    auVar87._12_4_ = auVar86._12_4_ * (fVar98 + fVar98);
                    auVar62._8_4_ = 0x40000000;
                    auVar62._0_8_ = 0x4000000040000000;
                    auVar62._12_4_ = 0x40000000;
                    auVar103 = vsubps_avx(auVar62,auVar87);
                    auVar45._0_4_ = fVar30 + fVar30 + -1.0 + fVar30 * auVar103._0_4_;
                    auVar45._4_4_ = fVar43 + fVar43 + -1.0 + fVar43 * auVar103._4_4_;
                    auVar45._8_4_ = fVar96 + fVar96 + -1.0 + fVar96 * auVar103._8_4_;
                    auVar45._12_4_ = fVar98 + fVar98 + -1.0 + fVar98 * auVar103._12_4_;
                    goto LAB_004346a9;
                  case 6:
                    fVar127 = **(float **)(&this->field_0x118 + (long)p_Var23);
                    fVar129 = (*(float **)(&this->field_0x118 + (long)p_Var23))[1];
                    auVar126._0_4_ = fVar127 * fVar30 + fVar129;
                    auVar126._4_4_ = fVar127 * fVar43 + fVar129;
                    auVar126._8_4_ = fVar127 * fVar96 + fVar129;
                    auVar126._12_4_ = fVar127 * fVar98 + fVar129;
                    auVar103 = vmaxps_avx(auVar126,(undefined1  [16])0x0);
                    auVar103 = vminps_avx(auVar45,auVar103);
                    auVar65._0_4_ = auVar103._0_4_ * fVar30;
                    auVar65._4_4_ = auVar103._4_4_ * fVar43;
                    auVar65._8_4_ = auVar103._8_4_ * fVar96;
                    auVar65._12_4_ = auVar103._12_4_ * fVar98;
                    auVar93._0_4_ = fVar127 * auVar72._0_4_ + fVar129;
                    auVar93._4_4_ = fVar127 * fVar2 + fVar129;
                    auVar93._8_4_ = fVar127 * fVar44 + fVar129;
                    auVar93._12_4_ = fVar127 * fVar10 + fVar129;
                    auVar103 = vmaxps_avx(auVar93,(undefined1  [16])0x0);
                    auVar45 = vminps_avx(auVar45,auVar103);
LAB_004346a9:
                    auVar72._0_4_ = auVar45._0_4_ * auVar72._0_4_;
                    auVar72._4_4_ = auVar45._4_4_ * fVar2;
                    auVar72._8_4_ = auVar45._8_4_ * fVar44;
                    auVar72._12_4_ = auVar45._12_4_ * fVar10;
                  }
                  if (iVar3 < 0x65) {
                    *pauVar37 = auVar65;
                    pauVar37[1] = auVar72;
                    pauVar37 = pauVar37 + 2;
                  }
                  else {
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var23) +
                                      local_2f8 * 0x20);
                    auVar69._0_4_ = auVar65._0_4_ * *pfVar1;
                    auVar69._4_4_ = auVar65._4_4_ * pfVar1[1];
                    auVar69._8_4_ = auVar65._8_4_ * pfVar1[2];
                    auVar69._12_4_ = auVar65._12_4_ * pfVar1[3];
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var23) + 0x10 +
                                      local_2f8 * 0x20);
                    auVar76._0_4_ = auVar72._0_4_ * *pfVar1;
                    auVar76._4_4_ = auVar72._4_4_ * pfVar1[1];
                    auVar76._8_4_ = auVar72._8_4_ * pfVar1[2];
                    auVar76._12_4_ = auVar72._12_4_ * pfVar1[3];
                    auVar63._8_4_ = 0x80000000;
                    auVar63._0_8_ = 0x8000000080000000;
                    auVar63._12_4_ = 0x80000000;
                    auVar45 = vandps_avx(auVar69,auVar63);
                    auVar103 = vandps_avx(auVar76,auVar63);
                    auVar45 = vorps_avx(auVar45,auVar53._0_16_);
                    auVar103 = vorps_avx(auVar103,auVar53._0_16_);
                    auVar70._0_4_ = (int)(auVar69._0_4_ + auVar45._0_4_);
                    auVar70._4_4_ = (int)(auVar69._4_4_ + auVar45._4_4_);
                    auVar70._8_4_ = (int)(auVar69._8_4_ + auVar45._8_4_);
                    auVar70._12_4_ = (int)(auVar69._12_4_ + auVar45._12_4_);
                    auVar77._0_4_ = (int)(auVar76._0_4_ + auVar103._0_4_);
                    auVar77._4_4_ = (int)(auVar76._4_4_ + auVar103._4_4_);
                    auVar77._8_4_ = (int)(auVar76._8_4_ + auVar103._8_4_);
                    auVar77._12_4_ = (int)(auVar76._12_4_ + auVar103._12_4_);
                    auVar45 = vpackssdw_avx(auVar70,auVar77);
                    auVar45 = vpminsw_avx(auVar45,_DAT_00528d20);
                    auVar45 = vpmaxsw_avx(auVar45,_DAT_00528d30);
                    auVar45 = vpacksswb_avx(auVar45,auVar45);
                    *(long *)*pauVar34 = auVar45._0_8_;
                    pauVar34 = (undefined1 (*) [16])((long)*pauVar34 + 8);
                  }
                  bVar42 = iVar29 != iVar27;
                  iVar29 = iVar29 + 1;
                } while (bVar42);
              }
              pp_Var19 = (_func_int **)(ulong)(iVar35 + 1);
            } while (iVar35 != (int)local_230);
          }
          local_2f8 = local_2f8 + 1;
          local_298 = (ulong)(uint)((int)local_298 + (int)uVar41 * 8);
        } while (local_2f8 != local_280);
      }
      local_288 = top_blob;
      if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
        uVar41 = local_2e8._16_8_ - local_2e8._0_8_;
        pfVar32 = (pointer)local_2e8._0_8_;
LAB_00435611:
        operator_delete(pfVar32,uVar41);
      }
    }
    iVar25 = 0;
    goto LAB_004356fe;
  }
  uVar21 = *(uint *)(&this->field_0xd0 + (long)p_Var23);
  iVar27 = *(int *)(&this->field_0x10c + (long)p_Var23);
  local_298 = 1;
  if (opt->use_packing_layout == true) {
    if (iVar27 < 0x65) {
      local_298 = (ulong)((uint)((uVar21 & 3) == 0) * 3 + 1);
    }
    else {
      local_298 = 1;
      if ((uVar21 & 7) == 0) {
        local_298 = 8;
      }
    }
  }
  iVar3 = (int)local_298;
  uVar41 = (ulong)(uint)(iVar3 * 4);
  if (100 < iVar27) {
    uVar41 = local_298;
  }
  local_290 = (_func_int **)CONCAT44(local_290._4_4_,iVar29);
  Mat::create(top_blob,iVar29,iVar35,(int)uVar21 / iVar3,uVar41,iVar3,opt->blob_allocator);
  auVar16 = stack0xfffffffffffffd38;
  iVar25 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_004356fe;
  uVar28 = (int)uVar28 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
  uVar21 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
  iVar29 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    iVar29 = 1;
    if ((uVar28 & 7) == 0) {
      iVar29 = 8;
    }
    if (iVar27 < 0x65) {
      _elempack = (uint)((uVar21 & 3) == 0) * 3 + 1;
    }
    else {
      _elempack = 1;
      if ((uVar21 & 7) == 0) {
        _elempack = 8;
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  local_2e8._12_4_ = local_228.refcount._4_4_;
  local_2e8._8_4_ = local_228.refcount._0_4_;
  local_2e8._0_8_ = local_228.data;
  local_2e8._16_8_ = local_228.elemsize;
  local_2e8._24_4_ = local_228.elempack;
  uStack_2c0._4_4_ = local_228.w;
  uStack_2c0._0_4_ = local_228.dims;
  uStack_2b8._4_4_ = local_228.d;
  uStack_2b8._0_4_ = local_228.h;
  local_2e8._32_8_ = local_228.allocator;
  uStack_2ac = auVar16._28_4_;
  iStack_2b0 = local_228.c;
  local_2a8 = local_228.cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  if (iVar29 < iVar5) {
    local_278.data = *(void **)opt;
    local_278.elemsize = (size_t)opt->workspace_allocator;
    local_278.elempack = opt->openmp_blocktime;
    local_278._28_1_ = opt->use_winograd_convolution;
    local_278._29_1_ = opt->use_sgemm_convolution;
    local_278._30_1_ = opt->use_int8_inference;
    local_278._31_1_ = opt->use_vulkan_compute;
    local_278.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_278._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_278._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_278._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
    local_278.refcount = (int *)opt->workspace_allocator;
    convert_packing(&local_228,(Mat *)local_2e8,iVar29,(Option *)&local_278);
  }
  piVar6 = top_blob->refcount;
  local_278.data = top_blob->data;
  local_278.refcount = top_blob->refcount;
  local_278.elemsize = top_blob->elemsize;
  local_278.elempack = top_blob->elempack;
  local_278.allocator = top_blob->allocator;
  local_278.dims = top_blob->dims;
  local_278.w = top_blob->w;
  local_278.h = top_blob->h;
  local_278.d = top_blob->d;
  local_278.c = top_blob->c;
  local_278.cstep = top_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  pp_Var22 = this->_vptr_ConvolutionDepthWise_x86_avx;
  if (_elempack < (uint)local_298) {
    Mat::create(&local_278,(int)local_290,iVar35,
                *(int *)(&this->field_0xd0 + (long)pp_Var22[-3]) / (int)_elempack,
                (ulong)((byte)((ushort)uVar41 / (ushort)(byte)local_298) * _elempack),_elempack,
                opt->workspace_allocator);
    iVar25 = -100;
    if ((local_278.data != (void *)0x0) && ((long)local_278.c * local_278.cstep != 0)) {
      pp_Var22 = this->_vptr_ConvolutionDepthWise_x86_avx;
      goto LAB_00434a94;
    }
  }
  else {
LAB_00434a94:
    local_288 = top_blob;
    if (0 < *(int *)(&this->field_0x108 + (long)pp_Var22[-3])) {
      local_290 = (_func_int **)CONCAT44(local_290._4_4_,(int)uVar28 / iVar29);
      iVar27 = 0;
      iVar35 = 0;
      lVar26 = 0;
      do {
        auVar16 = stack0xfffffffffffffd38;
        local_1c8 = (pointer)((long)(iVar27 / iVar29) * local_2a8 * local_2e8._16_8_ +
                             local_2e8._0_8_);
        local_1c0 = (int *)0x0;
        local_1b8 = (Allocator *)local_2e8._16_8_;
        local_1b0 = local_2e8._24_4_;
        local_1a8 = (Allocator *)local_2e8._32_8_;
        local_190 = (int)local_290;
        uVar15 = uStack_2c0;
        uVar17 = uStack_2b8;
        local_188 = ((long)uStack_2b8._4_4_ * local_2e8._16_8_ *
                     (long)(int)uStack_2b8 * (long)uStack_2c0._4_4_ + 0xfU & 0xfffffffffffffff0) /
                    (ulong)local_2e8._16_8_;
        uStack_2c0._0_4_ = (int)uVar15;
        uStack_2c0._4_4_ = SUB84(uVar15,4);
        local_1a0 = (int)uStack_2c0;
        iStack_19c = uStack_2c0._4_4_;
        uStack_2b8._0_4_ = (int)uVar17;
        uStack_2b8._4_4_ = SUB84(uVar17,4);
        iStack_198 = (int)uStack_2b8;
        iStack_194 = uStack_2b8._4_4_;
        local_120 = (void *)((long)(iVar35 / (int)_elempack) * local_278.cstep * local_278.elemsize
                            + (long)local_278.data);
        local_118 = (int *)0x0;
        local_110 = local_278.elemsize;
        local_108 = local_278.elempack;
        local_100 = local_278.allocator;
        local_e0 = ((long)local_278.d * local_278.elemsize * (long)local_278.h * (long)local_278.w +
                    0xf & 0xfffffffffffffff0) / local_278.elemsize;
        local_f8 = local_278.dims;
        iStack_f4 = local_278.w;
        iStack_f0 = local_278.h;
        iStack_ec = local_278.d;
        pLVar9 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar26];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        pAStack_68 = opt->workspace_allocator;
        uStack_60._0_4_ = opt->openmp_blocktime;
        uStack_60._4_1_ = opt->use_winograd_convolution;
        uStack_60._5_1_ = opt->use_sgemm_convolution;
        uStack_60._6_1_ = opt->use_int8_inference;
        uStack_60._7_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        local_58._4_1_ = opt->use_int8_packed;
        local_58._5_1_ = opt->use_int8_storage;
        local_58._6_1_ = opt->use_int8_arithmetic;
        local_58._7_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_50._4_1_ = opt->use_subgroup_shuffle;
        uStack_50._5_1_ = opt->use_image_storage;
        uStack_50._6_1_ = opt->use_tensor_storage;
        uStack_50._7_1_ = opt->use_reserved_0;
        uStack_48._0_4_ = opt->flush_denormals;
        uStack_48._4_1_ = opt->use_local_pool_allocator;
        uStack_48._5_1_ = opt->use_shader_local_memory;
        uStack_48._6_1_ = opt->use_cooperative_matrix;
        uStack_48._7_1_ = opt->use_winograd23_convolution;
        uStack_40._0_1_ = opt->use_winograd43_convolution;
        uStack_40._1_1_ = opt->use_winograd63_convolution;
        uStack_40._2_1_ = opt->use_reserved_6;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = local_278.allocator;
        unique0x10007f47 = auVar16;
        local_e8 = (int)uVar21 / (int)_elempack;
        (*pLVar9->_vptr_Layer[7])(pLVar9,&local_1c8,&local_120);
        if (local_118 != (int *)0x0) {
          LOCK();
          *local_118 = *local_118 + -1;
          UNLOCK();
          if (*local_118 == 0) {
            if (local_100 == (Allocator *)0x0) {
              if (local_120 != (void *)0x0) {
                free(local_120);
              }
            }
            else {
              (*local_100->_vptr_Allocator[3])();
            }
          }
        }
        if (local_1c0 != (int *)0x0) {
          LOCK();
          *local_1c0 = *local_1c0 + -1;
          UNLOCK();
          if (*local_1c0 == 0) {
            if (local_1a8 == (Allocator *)0x0) {
              if (local_1c8 != (pointer)0x0) {
                free(local_1c8);
              }
            }
            else {
              (*local_1a8->_vptr_Allocator[3])();
            }
          }
        }
        lVar26 = lVar26 + 1;
        iVar35 = iVar35 + uVar21;
        iVar27 = iVar27 + uVar28;
      } while (lVar26 < *(int *)(&this->field_0x108 +
                                (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
    }
    pMVar14 = local_288;
    if (_elempack < (uint)local_298) {
      convert_packing(&local_278,local_288,(uint)local_298,opt);
      iVar25 = 0;
    }
    else {
      iVar25 = 0;
      if (&local_278 != local_288) {
        if (local_278.refcount != (int *)0x0) {
          LOCK();
          *local_278.refcount = *local_278.refcount + 1;
          UNLOCK();
        }
        piVar6 = local_288->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_288->allocator == (Allocator *)0x0) {
              if (local_288->data != (void *)0x0) {
                free(local_288->data);
              }
            }
            else {
              (*local_288->allocator->_vptr_Allocator[3])();
            }
          }
        }
        iVar25 = 0;
        pMVar14->data = local_278.data;
        pMVar14->refcount = local_278.refcount;
        pMVar14->elemsize = local_278.elemsize;
        pMVar14->elempack = local_278.elempack;
        pMVar14->allocator = local_278.allocator;
        pMVar14->dims = local_278.dims;
        pMVar14->w = local_278.w;
        pMVar14->h = local_278.h;
        pMVar14->d = local_278.d;
        pMVar14->c = local_278.c;
        pMVar14->cstep = local_278.cstep;
      }
    }
  }
  if (local_278.refcount != (int *)0x0) {
    LOCK();
    *local_278.refcount = *local_278.refcount + -1;
    UNLOCK();
    if (*local_278.refcount == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        if (local_278.data != (void *)0x0) {
          free(local_278.data);
        }
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if ((Allocator *)local_2e8._8_8_ != (Allocator *)0x0) {
    LOCK();
    *(int *)(_func_int ***)local_2e8._8_8_ = *(int *)(_func_int ***)local_2e8._8_8_ + -1;
    UNLOCK();
    if (*(int *)(_func_int ***)local_2e8._8_8_ == 0) {
      if ((Allocator *)local_2e8._32_8_ == (Allocator *)0x0) {
        if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
          free((void *)local_2e8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_2e8._32_8_)[3])();
      }
    }
  }
LAB_004356fe:
  piVar6 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        if (local_228.data != (void *)0x0) {
          free(local_228.data);
        }
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_168.refcount != (int *)0x0) {
    LOCK();
    *local_168.refcount = *local_168.refcount + -1;
    UNLOCK();
    if (*local_168.refcount == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if (local_168.data != (void *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar25;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}